

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum.c
# Opt level: O1

void bn_mont_reduction_u32(uint32_t len,uint32_t *n,uint32_t nInv,uint32_t *c,uint32_t *res)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  size_t __n;
  long lVar6;
  uint uVar7;
  uint32_t *os;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint32_t *puVar12;
  ulong uVar13;
  uint32_t *puVar14;
  ulong uVar15;
  void *__s;
  ulong uVar16;
  bool bVar17;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 local_50;
  uint32_t *local_48;
  size_t local_40;
  uint local_34;
  
  uVar16 = (ulong)len;
  local_34 = 0;
  if (len != 0) {
    local_58 = (ulong)(len & 0xfffffffc);
    puVar12 = c + 3;
    uVar13 = 0;
    bVar17 = false;
    puVar14 = c;
    do {
      uVar15 = (ulong)(c[uVar13] * nInv);
      uVar10 = 0;
      if (3 < len) {
        lVar8 = 0;
        uVar10 = 0;
        do {
          uVar10 = *(uint *)((long)n + lVar8) * uVar15 +
                   *(uint *)((long)puVar12 + lVar8 + -0xc) + uVar10;
          *(int *)((long)puVar12 + lVar8 + -0xc) = (int)uVar10;
          uVar10 = *(uint *)((long)n + lVar8 + 4) * uVar15 +
                   (ulong)*(uint *)((long)puVar12 + lVar8 + -8) + (uVar10 >> 0x20);
          *(int *)((long)puVar12 + lVar8 + -8) = (int)uVar10;
          uVar10 = *(uint *)((long)n + lVar8 + 8) * uVar15 +
                   (ulong)*(uint *)((long)puVar12 + lVar8 + -4) + (uVar10 >> 0x20);
          *(int *)((long)puVar12 + lVar8 + -4) = (int)uVar10;
          uVar10 = *(uint *)((long)n + lVar8 + 0xc) * uVar15 +
                   (ulong)*(uint *)((long)puVar12 + lVar8) + (uVar10 >> 0x20);
          *(int *)((long)puVar12 + lVar8) = (int)uVar10;
          uVar10 = uVar10 >> 0x20;
          lVar8 = lVar8 + 0x10;
        } while ((ulong)(len >> 2) << 4 != lVar8);
      }
      uVar7 = (uint)uVar10;
      uVar9 = local_58;
      if ((len & 3) != 0) {
        do {
          uVar11 = uVar10 + puVar14[uVar9] + n[uVar9] * uVar15;
          puVar14[uVar9] = (uint32_t)uVar11;
          uVar10 = uVar11 >> 0x20;
          uVar7 = (uint)(uVar11 >> 0x20);
          uVar9 = uVar9 + 1;
        } while (uVar9 < uVar16);
      }
      uVar2 = (uint)bVar17;
      uVar3 = uVar7 + c[(int)uVar13 + len];
      bVar17 = CARRY4(uVar7,c[(int)uVar13 + len]) || CARRY4(uVar3,uVar2);
      c[uVar16 + uVar13] = uVar3 + uVar2;
      uVar13 = uVar13 + 1;
      puVar12 = puVar12 + 1;
      puVar14 = puVar14 + 1;
    } while (uVar13 != uVar16);
    local_34 = (uint)bVar17;
    local_50 = c;
    local_48 = res;
  }
  local_40 = uVar16 * 4;
  uStack_60 = 0x1360e3;
  memcpy(res,c + uVar16,local_40);
  __n = local_40;
  lVar8 = -(uVar16 * 4 + 0xf & 0xfffffffffffffff0);
  __s = (void *)((long)&local_58 + lVar8);
  *(undefined8 *)((long)&uStack_60 + lVar8) = 0x136106;
  memset(__s,0,__n);
  uVar7 = 0;
  if (3 < len) {
    lVar6 = 0;
    bVar17 = false;
    do {
      uVar7 = *(uint *)((long)res + lVar6);
      uVar2 = *(uint *)((long)n + lVar6);
      uVar4 = uVar7 - *(uint *)((long)n + lVar6);
      *(uint *)((long)__s + lVar6) = uVar4 - bVar17;
      uVar3 = *(uint *)((long)res + lVar6 + 4);
      puVar1 = (uint *)((long)n + lVar6 + 4);
      uVar4 = (uint)(uVar7 < uVar2 || uVar4 < bVar17);
      uVar7 = *puVar1;
      uVar5 = uVar3 - *puVar1;
      *(uint *)((long)&local_58 + lVar6 + lVar8 + 4) = uVar5 - uVar4;
      uVar2 = *(uint *)((long)res + lVar6 + 8);
      puVar1 = (uint *)((long)n + lVar6 + 8);
      uVar4 = (uint)(uVar3 < uVar7 || uVar5 < uVar4);
      uVar7 = *puVar1;
      uVar5 = uVar2 - *puVar1;
      *(uint *)((long)&local_50 + lVar6 + lVar8) = uVar5 - uVar4;
      uVar3 = *(uint *)((long)res + lVar6 + 0xc);
      puVar1 = (uint *)((long)n + lVar6 + 0xc);
      uVar7 = (uint)(uVar2 < uVar7 || uVar5 < uVar4);
      uVar2 = uVar3 - *puVar1;
      bVar17 = uVar3 < *puVar1 || uVar2 < uVar7;
      *(uint *)((long)&local_50 + lVar6 + lVar8 + 4) = uVar2 - uVar7;
      lVar6 = lVar6 + 0x10;
    } while ((ulong)(len >> 2) << 4 != lVar6);
    uVar7 = (uint)bVar17;
  }
  if ((len & 3) != 0) {
    uVar13 = (ulong)(len & 0xfffffffc);
    do {
      uVar2 = (uint)((char)uVar7 != '\0');
      uVar3 = res[uVar13] - n[uVar13];
      bVar17 = res[uVar13] < n[uVar13] || uVar3 < uVar2;
      uVar7 = (uint)bVar17;
      *(uint *)((long)__s + uVar13 * 4) = uVar3 - uVar2;
      uVar13 = uVar13 + 1;
    } while (uVar13 < uVar16);
    uVar7 = (uint)bVar17;
  }
  if (len != 0) {
    uVar13 = 0;
    do {
      res[uVar13] = *(uint *)((long)__s + uVar13 * 4) & ~(local_34 - uVar7) |
                    res[uVar13] & local_34 - uVar7;
      uVar13 = uVar13 + 1;
    } while (uVar16 != uVar13);
  }
  return;
}

Assistant:

static void
bn_mont_reduction_u32(uint32_t len, uint32_t *n, uint32_t nInv, uint32_t *c, uint32_t *res)
{
  uint32_t c0 = 0U;
  for (uint32_t i0 = 0U; i0 < len; i0++)
  {
    uint32_t qj = nInv * c[i0];
    uint32_t *res_j0 = c + i0;
    uint32_t c1 = 0U;
    for (uint32_t i = 0U; i < len / 4U; i++)
    {
      uint32_t a_i = n[4U * i];
      uint32_t *res_i0 = res_j0 + 4U * i;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u32(a_i, qj, c1, res_i0);
      uint32_t a_i0 = n[4U * i + 1U];
      uint32_t *res_i1 = res_j0 + 4U * i + 1U;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u32(a_i0, qj, c1, res_i1);
      uint32_t a_i1 = n[4U * i + 2U];
      uint32_t *res_i2 = res_j0 + 4U * i + 2U;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u32(a_i1, qj, c1, res_i2);
      uint32_t a_i2 = n[4U * i + 3U];
      uint32_t *res_i = res_j0 + 4U * i + 3U;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u32(a_i2, qj, c1, res_i);
    }
    for (uint32_t i = len / 4U * 4U; i < len; i++)
    {
      uint32_t a_i = n[i];
      uint32_t *res_i = res_j0 + i;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u32(a_i, qj, c1, res_i);
    }
    uint32_t r = c1;
    uint32_t c10 = r;
    uint32_t *resb = c + len + i0;
    uint32_t res_j = c[len + i0];
    c0 = Lib_IntTypes_Intrinsics_add_carry_u32(c0, c10, res_j, resb);
  }
  memcpy(res, c + len, (len + len - len) * sizeof (uint32_t));
  uint32_t c00 = c0;
  KRML_CHECK_SIZE(sizeof (uint32_t), len);
  uint32_t tmp[len];
  memset(tmp, 0U, len * sizeof (uint32_t));
  uint32_t c1 = 0U;
  for (uint32_t i = 0U; i < len / 4U; i++)
  {
    uint32_t t1 = res[4U * i];
    uint32_t t20 = n[4U * i];
    uint32_t *res_i0 = tmp + 4U * i;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u32(c1, t1, t20, res_i0);
    uint32_t t10 = res[4U * i + 1U];
    uint32_t t21 = n[4U * i + 1U];
    uint32_t *res_i1 = tmp + 4U * i + 1U;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u32(c1, t10, t21, res_i1);
    uint32_t t11 = res[4U * i + 2U];
    uint32_t t22 = n[4U * i + 2U];
    uint32_t *res_i2 = tmp + 4U * i + 2U;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u32(c1, t11, t22, res_i2);
    uint32_t t12 = res[4U * i + 3U];
    uint32_t t2 = n[4U * i + 3U];
    uint32_t *res_i = tmp + 4U * i + 3U;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u32(c1, t12, t2, res_i);
  }
  for (uint32_t i = len / 4U * 4U; i < len; i++)
  {
    uint32_t t1 = res[i];
    uint32_t t2 = n[i];
    uint32_t *res_i = tmp + i;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u32(c1, t1, t2, res_i);
  }
  uint32_t c10 = c1;
  uint32_t c2 = c00 - c10;
  for (uint32_t i = 0U; i < len; i++)
  {
    uint32_t *os = res;
    uint32_t x = (c2 & res[i]) | (~c2 & tmp[i]);
    os[i] = x;
  }
}